

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O2

matrix<trng::GF2,_4UL> * __thiscall
trng::power<trng::GF2,4ul>
          (matrix<trng::GF2,_4UL> *__return_storage_ptr__,trng *this,matrix<trng::GF2,_4UL> *a,
          unsigned_long_long m)

{
  matrix_type powers;
  _Vector_base<trng::GF2,_std::allocator<trng::GF2>_> local_50;
  _Vector_base<trng::GF2,_std::allocator<trng::GF2>_> local_38;
  
  matrix<trng::GF2,4ul>::
  matrix<trng::power<trng::GF2,4ul>(trng::matrix<trng::GF2,4ul>const&,unsigned_long_long)::_lambda(unsigned_long,unsigned_long)_1_>
            ();
  std::vector<trng::GF2,_std::allocator<trng::GF2>_>::vector
            ((vector<trng::GF2,_std::allocator<trng::GF2>_> *)&local_50,
             (vector<trng::GF2,_std::allocator<trng::GF2>_> *)this);
  for (; a != (matrix<trng::GF2,_4UL> *)0x0; a = (matrix<trng::GF2,_4UL> *)((ulong)a >> 1)) {
    if (((ulong)a & 1) != 0) {
      operator*((matrix<trng::GF2,_4UL> *)&local_38,__return_storage_ptr__,
                (matrix<trng::GF2,_4UL> *)&local_50);
      std::vector<trng::GF2,_std::allocator<trng::GF2>_>::_M_move_assign
                (&__return_storage_ptr__->data,&local_38);
      std::_Vector_base<trng::GF2,_std::allocator<trng::GF2>_>::~_Vector_base(&local_38);
    }
    if (a == (matrix<trng::GF2,_4UL> *)0x1) break;
    operator*((matrix<trng::GF2,_4UL> *)&local_38,(matrix<trng::GF2,_4UL> *)&local_50,
              (matrix<trng::GF2,_4UL> *)&local_50);
    std::vector<trng::GF2,_std::allocator<trng::GF2>_>::_M_move_assign
              ((vector<trng::GF2,_std::allocator<trng::GF2>_> *)&local_50,&local_38);
    std::_Vector_base<trng::GF2,_std::allocator<trng::GF2>_>::~_Vector_base(&local_38);
  }
  std::_Vector_base<trng::GF2,_std::allocator<trng::GF2>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> power(const matrix<T, n> &a, unsigned long long m) {
    using matrix_type = matrix<T, n>;
    using size_type = typename matrix_type::size_type;

    auto unit = [&](size_type i, size_type j) -> T { return i == j ? T{1} : T{0}; };
    matrix_type res(unit);
    matrix_type powers(a);
    while (m > 0) {
      if ((m & 1ull) == 1ull)
        res = res * powers;
      m >>= 1u;
      if (m == 0)
        break;
      powers = powers * powers;
    }
    return res;
  }